

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl.c
# Opt level: O0

int get_active_cq_level(RATE_CONTROL *rc,PRIMARY_RATE_CONTROL *p_rc,AV1EncoderConfig *oxcf,
                       int intra_only,aom_superres_mode superres_mode,int superres_denom)

{
  double dVar1;
  int local_44;
  double x;
  int mult;
  int active_cq_level;
  RateControlCfg *rc_cfg;
  int superres_denom_local;
  aom_superres_mode superres_mode_local;
  int intra_only_local;
  AV1EncoderConfig *oxcf_local;
  PRIMARY_RATE_CONTROL *p_rc_local;
  RATE_CONTROL *rc_local;
  
  active_cq_level = (oxcf->rc_cfg).cq_level;
  if (((((oxcf->rc_cfg).mode == AOM_CQ) || ((oxcf->rc_cfg).mode == AOM_Q)) &&
      ((superres_mode == AOM_SUPERRES_QTHRESH || (superres_mode == AOM_SUPERRES_AUTO)))) &&
     (superres_denom != 8)) {
    if ((intra_only == 0) || (1 < rc->frames_to_key)) {
      if (intra_only == 0) {
        mult = 0;
      }
      else {
        mult = 2;
      }
    }
    else {
      mult = 0;
    }
    if (active_cq_level - (superres_denom + -8) * mult < 1) {
      local_44 = 0;
    }
    else {
      local_44 = active_cq_level - (superres_denom + -8) * mult;
    }
    active_cq_level = local_44;
  }
  if ((((oxcf->rc_cfg).mode == AOM_CQ) && (0 < p_rc->total_target_bits)) &&
     (dVar1 = (double)p_rc->total_actual_bits / (double)p_rc->total_target_bits, dVar1 < 0.1)) {
    active_cq_level = (int)(((double)active_cq_level * dVar1) / 0.1);
  }
  return active_cq_level;
}

Assistant:

static int get_active_cq_level(const RATE_CONTROL *rc,
                               const PRIMARY_RATE_CONTROL *p_rc,
                               const AV1EncoderConfig *const oxcf,
                               int intra_only, aom_superres_mode superres_mode,
                               int superres_denom) {
  const RateControlCfg *const rc_cfg = &oxcf->rc_cfg;
  static const double cq_adjust_threshold = 0.1;
  int active_cq_level = rc_cfg->cq_level;
  if (rc_cfg->mode == AOM_CQ || rc_cfg->mode == AOM_Q) {
    if ((superres_mode == AOM_SUPERRES_QTHRESH ||
         superres_mode == AOM_SUPERRES_AUTO) &&
        superres_denom != SCALE_NUMERATOR) {
      int mult = SUPERRES_QADJ_PER_DENOM_KEYFRAME_SOLO;
      if (intra_only && rc->frames_to_key <= 1) {
        mult = 0;
      } else if (intra_only) {
        mult = SUPERRES_QADJ_PER_DENOM_KEYFRAME;
      } else {
        mult = SUPERRES_QADJ_PER_DENOM_ARFFRAME;
      }
      active_cq_level = AOMMAX(
          active_cq_level - ((superres_denom - SCALE_NUMERATOR) * mult), 0);
    }
  }
  if (rc_cfg->mode == AOM_CQ && p_rc->total_target_bits > 0) {
    const double x = (double)p_rc->total_actual_bits / p_rc->total_target_bits;
    if (x < cq_adjust_threshold) {
      active_cq_level = (int)(active_cq_level * x / cq_adjust_threshold);
    }
  }
  return active_cq_level;
}